

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O0

void maxPoolingInit(pBox *pbox,pBox *Matrix,int kernelSize,int stride,int flag)

{
  mydataFmt *pmVar1;
  ostream *this;
  undefined8 in_XMM0_Qa;
  undefined4 uVar3;
  double dVar2;
  int flag_local;
  int stride_local;
  int kernelSize_local;
  pBox *Matrix_local;
  pBox *pbox_local;
  
  uVar3 = (undefined4)((ulong)in_XMM0_Qa >> 0x20);
  if (flag == 1) {
    dVar2 = std::floor((double)CONCAT44(uVar3,(float)(pbox->width - kernelSize) / (float)stride +
                                              1.0));
    Matrix->width = (int)SUB84(dVar2,0);
    dVar2 = std::floor((double)CONCAT44((int)((ulong)dVar2 >> 0x20),
                                        (float)(pbox->height - kernelSize) / (float)stride + 1.0));
    Matrix->height = (int)SUB84(dVar2,0);
  }
  else {
    dVar2 = std::ceil((double)CONCAT44(uVar3,(float)(pbox->width - kernelSize) / (float)stride + 1.0
                                      ));
    Matrix->width = (int)SUB84(dVar2,0);
    dVar2 = std::ceil((double)CONCAT44((int)((ulong)dVar2 >> 0x20),
                                       (float)(pbox->height - kernelSize) / (float)stride + 1.0));
    Matrix->height = (int)SUB84(dVar2,0);
  }
  Matrix->channel = pbox->channel;
  pmVar1 = (mydataFmt *)malloc((long)(Matrix->channel * Matrix->width * Matrix->height) << 2);
  Matrix->pdata = pmVar1;
  if (Matrix->pdata == (mydataFmt *)0x0) {
    this = std::operator<<((ostream *)&std::cout,"the maxPoolingI nit is failed!!");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  memset(Matrix->pdata,0,(long)(Matrix->channel * Matrix->width * Matrix->height) << 2);
  return;
}

Assistant:

void maxPoolingInit(const pBox *pbox, pBox *Matrix, int kernelSize, int stride, int flag) {
    if (flag == 1) {
        Matrix->width = floor((float) (pbox->width - kernelSize) / stride + 1);
        Matrix->height = floor((float) (pbox->height - kernelSize) / stride + 1);
    } else {
        Matrix->width = ceil((float) (pbox->width - kernelSize) / stride + 1);
        Matrix->height = ceil((float) (pbox->height - kernelSize) / stride + 1);
    }
    Matrix->channel = pbox->channel;
    Matrix->pdata = (mydataFmt *) malloc(Matrix->channel * Matrix->width * Matrix->height * sizeof(mydataFmt));
    if (Matrix->pdata == NULL)cout << "the maxPoolingI nit is failed!!" << endl;
    memset(Matrix->pdata, 0, Matrix->channel * Matrix->width * Matrix->height * sizeof(mydataFmt));
}